

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqComms::queue_tx_function(ZmqComms *this)

{
  _Rb_tree_header *p_Var1;
  __int_type _Var2;
  bool bVar3;
  socket_base sVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  socket_t *psVar8;
  byte *in_RCX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  ActionMessage *command;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  ConnectionStatus status;
  pair<helics::route_id,_helics::ActionMessage> *ppVar9;
  pointer pcVar10;
  key_type *__k;
  context_t *context_;
  string *psVar12;
  int in_R8D;
  int iVar13;
  string_view message;
  string_view message_00;
  route_id rid;
  socket_t brokerPushSocket;
  socket_t controlSocket;
  vector<char,_std::allocator<char>_> buffer;
  shared_ptr<ZmqContextManager> ctx;
  socket_t zsock;
  string local_2b8;
  string *local_298;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_290;
  map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
  routes;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  interfaceAndPort;
  allocator<char> local_188 [32];
  undefined1 local_168 [32];
  Time TStack_148;
  Time local_140;
  Time TStack_138;
  Time local_130;
  byte abStack_128 [64];
  pointer pcStack_e8;
  size_t local_e0;
  byte *local_d8;
  undefined8 local_d0;
  pointer pbStack_c8;
  pointer local_c0;
  pointer pbStack_b8;
  string controlsockString;
  message_t msg;
  size_type sVar11;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  interfaceAndPort.first._M_dataplus._M_p = (pointer)&interfaceAndPort.first.field_2;
  interfaceAndPort.first._M_string_length = 0;
  interfaceAndPort.first.field_2._M_local_buf[0] = '\0';
  ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,&interfaceAndPort.first);
  std::__cxx11::string::~string((string *)&interfaceAndPort);
  zmq::socket_t::socket_t
            (&controlSocket,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,0);
  interfaceAndPort.first._M_dataplus._M_p._0_4_ = 200;
  zmq::detail::socket_base::setsockopt<int>
            (&controlSocket.super_socket_base,0x11,(int *)&interfaceAndPort);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&routes,"inproc://",(allocator<char> *)&local_2b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&routes,
                 &(this->super_NetworkCommsInterface).super_CommsInterface.name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,'_');
  std::operator+(&interfaceAndPort.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 &(this->super_NetworkCommsInterface).super_CommsInterface.randomID);
  std::operator+(&controlsockString,&interfaceAndPort.first,"_control");
  std::__cxx11::string::~string((string *)&interfaceAndPort);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&routes);
  zmq::detail::socket_base::connect
            (&controlSocket.super_socket_base,(int)controlsockString._M_dataplus._M_p,__addr,
             (socklen_t)in_RCX);
  iVar6 = initializeBrokerConnections(this,&controlSocket);
  if (iVar6 < 0) {
    status = (uint)(iVar6 != -3) * 2 + TERMINATED;
    CommsInterface::setTxStatus((CommsInterface *)this,status);
    psVar8 = &controlSocket;
  }
  else {
    zmq::socket_t::socket_t
              (&brokerPushSocket,
               ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               zcontext)._M_t.
               super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
               super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
               super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,8);
    interfaceAndPort.first._M_dataplus._M_p._0_4_ = 200;
    zmq::detail::socket_base::setsockopt<int>
              (&brokerPushSocket.super_socket_base,0x11,(int *)&interfaceAndPort);
    routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &routes._M_t._M_impl.super__Rb_tree_header._M_header;
    routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_298 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      gmlc::networking::makePortAddress
                (&interfaceAndPort.first,local_298,(this->super_NetworkCommsInterface).brokerPort);
      zmq::detail::socket_base::connect
                (&brokerPushSocket.super_socket_base,(int)interfaceAndPort.first._M_dataplus._M_p,
                 __addr_00,(socklen_t)in_RCX);
      std::__cxx11::string::~string((string *)&interfaceAndPort);
    }
    CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    zmq::message_t::message_t(&msg);
    local_290 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    do {
      rid.rid = -0x4d3263e0;
      local_168._0_8_ = (pointer)0x0;
      local_168._8_8_ = 0x9aac0f0000000000;
      local_168._16_8_ = 0x9aac0f0000000000;
      abStack_128[0x38] = 0;
      abStack_128[0x39] = 0;
      abStack_128[0x3a] = 0;
      abStack_128[0x3b] = 0;
      abStack_128[0x3c] = 0;
      abStack_128[0x3d] = 0;
      abStack_128[0x3e] = 0;
      abStack_128[0x3f] = 0;
      pcStack_e8 = (pointer)0x0;
      abStack_128[0x28] = 0;
      abStack_128[0x29] = 0;
      abStack_128[0x2a] = 0;
      abStack_128[0x2b] = 0;
      abStack_128[0x2c] = 0;
      abStack_128[0x2d] = 0;
      abStack_128[0x2e] = 0;
      abStack_128[0x2f] = 0;
      abStack_128[0x30] = 0;
      abStack_128[0x31] = 0;
      abStack_128[0x32] = 0;
      abStack_128[0x33] = 0;
      abStack_128[0x34] = 0;
      abStack_128[0x35] = 0;
      abStack_128[0x36] = 0;
      abStack_128[0x37] = 0;
      abStack_128[0x18] = 0;
      abStack_128[0x19] = 0;
      abStack_128[0x1a] = 0;
      abStack_128[0x1b] = 0;
      abStack_128[0x1c] = 0;
      abStack_128[0x1d] = 0;
      abStack_128[0x1e] = 0;
      abStack_128[0x1f] = 0;
      abStack_128[0x20] = 0;
      abStack_128[0x21] = 0;
      abStack_128[0x22] = 0;
      abStack_128[0x23] = 0;
      abStack_128[0x24] = 0;
      abStack_128[0x25] = 0;
      abStack_128[0x26] = 0;
      abStack_128[0x27] = 0;
      abStack_128[8] = 0;
      abStack_128[9] = 0;
      abStack_128[10] = 0;
      abStack_128[0xb] = 0;
      abStack_128[0xc] = 0;
      abStack_128[0xd] = 0;
      abStack_128[0xe] = 0;
      abStack_128[0xf] = 0;
      abStack_128[0x10] = 0;
      abStack_128[0x11] = 0;
      abStack_128[0x12] = 0;
      abStack_128[0x13] = 0;
      abStack_128[0x14] = 0;
      abStack_128[0x15] = 0;
      abStack_128[0x16] = 0;
      abStack_128[0x17] = 0;
      local_130.internalTimeCode = 0;
      abStack_128[0] = 0;
      abStack_128[1] = 0;
      abStack_128[2] = 0;
      abStack_128[3] = 0;
      abStack_128[4] = 0;
      abStack_128[5] = 0;
      abStack_128[6] = 0;
      abStack_128[7] = 0;
      local_140.internalTimeCode = 0;
      TStack_138.internalTimeCode = 0;
      local_168._24_8_ = 0;
      TStack_148.internalTimeCode = 0;
      local_e0 = 0x40;
      local_d8 = abStack_128;
      local_c0 = (pointer)0x0;
      pbStack_b8 = (pointer)0x0;
      local_d0._0_1_ = false;
      local_d0._1_1_ = false;
      local_d0._2_1_ = false;
      local_d0._3_1_ = '\0';
      local_d0._4_4_ = 0;
      pbStack_c8 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)&interfaceAndPort,local_290);
      local_2b8._M_string_length = (size_type)&rid;
      ppVar9 = (pair<helics::route_id,_helics::ActionMessage> *)&interfaceAndPort;
      local_2b8._M_dataplus._M_p = (pointer)local_168;
      std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
                ((tuple<helics::route_id&,helics::ActionMessage&> *)&local_2b8,
                 (pair<helics::route_id,_helics::ActionMessage> *)&interfaceAndPort);
      iVar6 = (int)ppVar9;
      ActionMessage::~ActionMessage((ActionMessage *)&interfaceAndPort.first._M_string_length);
      if ((((local_168._0_4_ != cmd_protocol_priority) && (local_168._0_4_ != cmd_protocol_big)) &&
          (local_168._0_4_ != cmd_protocol)) || (rid.rid != -1)) goto LAB_00273416;
      if (local_168._4_4_ == 0xe9) {
        zsock.super_socket_base._handle = pcStack_e8;
        zsock.ctxptr = local_d8;
        in_RCX = local_d8;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_2b8,(basic_string_view<char,_std::char_traits<char>_> *)&zsock,
                   local_188);
        gmlc::networking::extractInterfaceAndPort(&interfaceAndPort,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        zmq::socket_t::socket_t
                  (&zsock,((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->zcontext)._M_t.
                          super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>
                          .super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,8);
        local_2b8._M_dataplus._M_p._0_4_ = 100;
        zmq::detail::socket_base::setsockopt<int>((socket_base *)&zsock,0x11,(int *)&local_2b8);
        gmlc::networking::makePortAddress
                  (&local_2b8,(string *)&interfaceAndPort,interfaceAndPort.second);
        zmq::detail::socket_base::connect
                  ((socket_base *)&zsock,(int)local_2b8._M_dataplus._M_p,__addr_02,(socklen_t)in_RCX
                  );
        std::__cxx11::string::~string((string *)&local_2b8);
        local_2b8._M_dataplus._M_p._0_4_ = local_168._20_4_;
        psVar12 = &local_2b8;
        std::
        _Rb_tree<helics::route_id,std::pair<helics::route_id_const,zmq::socket_t>,std::_Select1st<std::pair<helics::route_id_const,zmq::socket_t>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
        ::_M_emplace_unique<helics::route_id,zmq::socket_t>
                  ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,zmq::socket_t>,std::_Select1st<std::pair<helics::route_id_const,zmq::socket_t>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
                    *)&routes,(route_id *)&local_2b8,&zsock);
        iVar6 = (int)psVar12;
        zmq::socket_t::close(&zsock,iVar6);
        std::__cxx11::string::~string((string *)&interfaceAndPort);
LAB_0027352b:
        bVar3 = false;
        iVar13 = 2;
      }
      else {
        if (local_168._4_4_ == 0xf4) {
          interfaceAndPort.first._M_dataplus._M_p._0_4_ = local_168._20_4_;
          ppVar9 = (pair<helics::route_id,_helics::ActionMessage> *)&interfaceAndPort;
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
          ::erase(&routes._M_t,(key_type *)&interfaceAndPort);
          iVar6 = (int)ppVar9;
          goto LAB_0027352b;
        }
        if (local_168._4_4_ == 0x14d) {
          zmq::socket_t::close(&brokerPushSocket,iVar6);
          context_ = ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->zcontext)._M_t.
                     super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
                     super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl;
          zmq::socket_t::socket_t((socket_t *)&interfaceAndPort,context_,8);
          sVar4 = brokerPushSocket.super_socket_base;
          brokerPushSocket.super_socket_base._handle = interfaceAndPort.first._M_dataplus._M_p;
          interfaceAndPort.first._M_dataplus._M_p = (pointer)sVar4._handle;
          zmq::socket_t::close((socket_t *)&interfaceAndPort,(int)context_);
          interfaceAndPort.first._M_dataplus._M_p._0_4_ = 200;
          zmq::detail::socket_base::setsockopt<int>
                    (&brokerPushSocket.super_socket_base,0x11,(int *)&interfaceAndPort);
          psVar12 = local_298;
          interfaceAndPort.first._M_dataplus._M_p = pcStack_e8;
          interfaceAndPort.first._M_string_length = (size_type)local_d8;
          in_RCX = local_d8;
          std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)local_298,
                     (basic_string_view<char,_std::char_traits<char>_> *)&interfaceAndPort);
          (this->super_NetworkCommsInterface).brokerPort = local_168._20_4_;
          gmlc::networking::makePortAddress((string *)&interfaceAndPort,psVar12,local_168._20_4_);
          zmq::detail::socket_base::connect
                    (&brokerPushSocket.super_socket_base,
                     (int)interfaceAndPort.first._M_dataplus._M_p,__addr_01,(socklen_t)in_RCX);
          std::__cxx11::string::~string((string *)&interfaceAndPort);
LAB_00273416:
          if (((uint)rid.rid >> 0x18 == 10) ||
             ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == true)
             ) {
            ActionMessage::to_json_string_abi_cxx11_
                      ((string *)&interfaceAndPort,(ActionMessage *)local_168);
            std::vector<char,_std::allocator<char>_>::resize
                      (&buffer,interfaceAndPort.first._M_string_length);
            if (interfaceAndPort.first._M_string_length != 0) {
              memmove(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,interfaceAndPort.first._M_dataplus._M_p,
                      interfaceAndPort.first._M_string_length);
            }
            std::__cxx11::string::~string((string *)&interfaceAndPort);
          }
          else {
            ActionMessage::to_vector((ActionMessage *)local_168,&buffer);
          }
          if (rid.rid == -1) {
            in_RCX = (byte *)0x1;
            pcVar10 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            zmq::detail::socket_base::send
                      (&controlSocket.super_socket_base,
                       (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                       buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                       -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,1,in_R8D);
            iVar6 = (int)pcVar10;
            goto LAB_0027352b;
          }
          if (rid.rid == 0) {
            if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
              bVar3 = false;
              iVar6 = 0x1e;
              message._M_str = "no route to broker for message";
              message._M_len = 0x1e;
              CommsInterface::logWarning((CommsInterface *)this,message);
              iVar13 = 0;
            }
            else {
              bVar3 = false;
              in_RCX = (byte *)0x0;
              pcVar10 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              zmq::detail::socket_base::send
                        (&brokerPushSocket.super_socket_base,
                         (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,0,in_R8D);
              iVar6 = (int)pcVar10;
              iVar13 = 0;
            }
          }
          else {
            __k = &rid;
            iVar7 = std::
                    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                    ::find(&routes._M_t,__k);
            iVar6 = (int)__k;
            p_Var1 = &routes._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
              _Var2 = (this->super_NetworkCommsInterface).hasBroker._M_base._M_i;
              in_RCX = (byte *)CONCAT71((int7)((ulong)p_Var1 >> 8),_Var2);
              psVar8 = &brokerPushSocket;
              if ((_Var2 & 1U) == 0) {
                bVar5 = isIgnoreableCommand((ActionMessage *)local_168);
                bVar3 = false;
                iVar13 = 0;
                if (!bVar5) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2b8,"unknown route and no broker, dropping message ",
                             local_188);
                  prettyPrintString_abi_cxx11_((string *)&zsock,(helics *)local_168,command);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&interfaceAndPort,&local_2b8,(string *)&zsock);
                  message_00._M_str = interfaceAndPort.first._M_dataplus._M_p;
                  message_00._M_len = interfaceAndPort.first._M_string_length;
                  sVar11 = interfaceAndPort.first._M_string_length;
                  CommsInterface::logWarning((CommsInterface *)this,message_00);
                  iVar6 = (int)sVar11;
                  std::__cxx11::string::~string((string *)&interfaceAndPort);
                  std::__cxx11::string::~string((string *)&zsock);
                  std::__cxx11::string::~string((string *)&local_2b8);
                  bVar3 = false;
                  iVar13 = 0;
                }
                goto LAB_0027359e;
              }
            }
            else {
              psVar8 = (socket_t *)&iVar7._M_node[1]._M_parent;
            }
            bVar3 = false;
            in_RCX = (byte *)0x0;
            pcVar10 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            zmq::detail::socket_base::send
                      (&psVar8->super_socket_base,
                       (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                       buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                       -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,0,in_R8D);
            iVar6 = (int)pcVar10;
            iVar13 = 0;
          }
        }
        else {
          if (local_168._4_4_ == 0x7cd) {
            CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
            goto LAB_00273416;
          }
          bVar3 = true;
          iVar13 = 2;
          if (local_168._4_4_ != 0x9db) goto LAB_00273416;
        }
      }
LAB_0027359e:
      ActionMessage::~ActionMessage((ActionMessage *)local_168);
    } while ((iVar13 != 3) && (!bVar3));
    zmq::socket_t::close(&brokerPushSocket,iVar6);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::clear(&routes._M_t);
    if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&interfaceAndPort,"close",(allocator<char> *)local_168);
      iVar6 = (int)&interfaceAndPort;
      zmq::detail::socket_base::send
                (&controlSocket.super_socket_base,iVar6,(void *)0x1,(size_t)in_RCX,in_R8D);
      std::__cxx11::string::~string((string *)&interfaceAndPort);
    }
    zmq::socket_t::close(&controlSocket,iVar6);
    status = TERMINATED;
    CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
    zmq::message_t::~message_t(&msg);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::~_Rb_tree(&routes._M_t);
    psVar8 = &brokerPushSocket;
  }
  zmq::socket_t::close(psVar8,status);
  std::__cxx11::string::~string((string *)&controlsockString);
  zmq::socket_t::close(&controlSocket,status);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void ZmqComms::queue_tx_function()
{
    std::vector<char> buffer;
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    auto ctx = ZmqContextManager::getContextPointer();
    // Setup the control socket for comms with the receiver
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    controlSocket.setsockopt(ZMQ_LINGER, 200);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    controlSocket.connect(controlsockString);
    try {
        auto res = initializeBrokerConnections(controlSocket);
        if (res < 0) {
            setTxStatus((res != -3) ? ConnectionStatus::ERRORED : ConnectionStatus::TERMINATED);

            controlSocket.close();
            return;
        }
    }
    catch (const zmq::error_t&) {
        controlSocket.close();
        return;
    }

    zmq::socket_t brokerPushSocket(ctx->getBaseContext(), ZMQ_PUSH);
    brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
    std::map<route_id, zmq::socket_t> routes;  // for all the other possible routes
    // ZmqRequestSets priority_routes;  //!< object to handle the management of the priority
    // routes

    if (hasBroker) {
        //   priority_routes.addRoutes (0, makePortAddress (brokerTargetAddress, brokerPort+1));
        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
    }
    setTxStatus(ConnectionStatus::CONNECTED);
    zmq::message_t msg;
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (control_route == rid) {
                switch (cmd.messageID) {
                    case RECONNECT_TRANSMITTER:
                        setTxStatus(ConnectionStatus::CONNECTED);
                        break;
                    case NEW_BROKER_INFORMATION:
                        brokerPushSocket.close();
                        brokerPushSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                        brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
                        brokerTargetAddress = cmd.payload.to_string();
                        brokerPort = cmd.getExtraData();
                        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
                        break;
                    case NEW_ROUTE: {
                        try {
                            auto interfaceAndPort = gmlc::networking::extractInterfaceAndPort(
                                std::string(cmd.payload.to_string()));

                            auto zsock = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                            zsock.setsockopt(ZMQ_LINGER, 100);
                            zsock.connect(
                                makePortAddress(interfaceAndPort.first, interfaceAndPort.second));
                            routes.emplace(route_id{cmd.getExtraData()}, std::move(zsock));
                        }
                        catch (const zmq::error_t& e) {
                            // TODO(PT): do something???
                            logError(std::string("unable to connect route") +
                                     std::string(cmd.payload.to_string()) + "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }
        if (getRouteTypeCode(rid) == json_route_code || useJsonSerialization) {
            auto str = cmd.to_json_string();
            buffer.resize(str.size());
            std::copy(str.begin(), str.end(), buffer.begin());

        } else {
            cmd.to_vector(buffer);
        }
        if (rid == parent_route_id) {
            if (hasBroker) {
                brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                      zmq::send_flags::none);
            } else {
                logWarning("no route to broker for message");
            }
        } else if (rid == control_route) {  // send to rx thread loop
            try {
                controlSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                   zmq::send_flags::dontwait);
            }
            catch (const zmq::error_t& e) {
                if ((getRxStatus() == ConnectionStatus::TERMINATED) ||
                    (getRxStatus() == ConnectionStatus::ERRORED)) {
                    break;
                }
                logError(e.what());
            }
            continue;
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                rt_find->second.send(zmq::const_buffer(buffer.data(), buffer.size()));
            } else {
                if (hasBroker) {
                    brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()));
                } else {
                    if (!isIgnoreableCommand(cmd)) {
                        logWarning(std::string("unknown route and no broker, dropping message ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    brokerPushSocket.close();

    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        try {
            controlSocket.send(std::string("close"), zmq::send_flags::dontwait);
        }
        catch (const zmq::error_t&) {
            // this probably just means it got closed simultaneously which would be unusual but
            // not impossible
        }
    }

    controlSocket.close();

    setTxStatus(ConnectionStatus::TERMINATED);
}